

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_pool.hpp
# Opt level: O0

void __thiscall
coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::
ExecutorWrapper(ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
                *this,basic_executor_type<std::allocator<void>,_0UL> *executor)

{
  Executor *in_RSI;
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffff98;
  allocator<char> local_31;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  async_simple::Executor::Executor(in_RSI,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI);
  std::allocator<char>::~allocator(&local_31);
  *in_RDI = &PTR__ExecutorWrapper_002289b8;
  asio::io_context::basic_executor_type<std::allocator<void>,_0UL>::basic_executor_type
            ((basic_executor_type<std::allocator<void>,_0UL> *)(in_RDI + 5),
             (basic_executor_type<std::allocator<void>,_0UL> *)in_RSI);
  return;
}

Assistant:

ExecutorWrapper(ExecutorImpl executor) : executor_(executor) {}